

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_allocator.cpp
# Opt level: O1

bool __thiscall duckdb::FixedSizeAllocator::InitializeVacuum(FixedSizeAllocator *this)

{
  _Hash_node_base *this_00;
  _Rb_tree_header *p_Var1;
  BlockManager *pBVar2;
  bool bVar3;
  pointer pFVar4;
  ulong uVar5;
  idx_t iVar6;
  idx_t iVar7;
  idx_t iVar8;
  __node_base_ptr p_Var9;
  __hash_code __code;
  __node_base_ptr p_Var10;
  __hashtable *__h;
  iterator __end1;
  _Hash_node_base *p_Var11;
  long lVar12;
  iterator __begin1;
  _Base_ptr p_Var13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  idx_t available_segments_in_buffer;
  multimap<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  temporary_vacuum_buffers;
  _Base_ptr local_68;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  local_60;
  
  if (this->total_segment_count == 0) {
    ::std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&(this->buffers)._M_h);
    ::std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::clear(&(this->buffers_with_free_space)._M_h);
    (this->buffer_with_free_space).index = 0xffffffffffffffff;
    this->total_segment_count = 0;
    bVar3 = false;
  }
  else {
    RemoveEmptyBuffers(this);
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    uVar5 = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var11 = (this->buffers)._M_h._M_before_begin._M_nxt;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if (p_Var11 != (_Hash_node_base *)0x0) {
      uVar5 = 0;
      do {
        this_00 = p_Var11 + 2;
        pFVar4 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                 ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                               *)this_00);
        pFVar4->vacuum = false;
        pFVar4 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                 ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                               *)this_00);
        bVar3 = BufferHandle::IsValid(&pFVar4->buffer_handle);
        if (bVar3) {
          iVar6 = this->available_segments_per_buffer;
          pFVar4 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                   ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                                 *)this_00);
          p_Var13 = (_Base_ptr)(iVar6 - pFVar4->segment_count);
          local_68 = p_Var13;
          ::std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::_Select1st<std::pair<unsigned_long_const,unsigned_long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
          ::_M_emplace_equal<unsigned_long&,unsigned_long_const&>
                    ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::_Select1st<std::pair<unsigned_long_const,unsigned_long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
                      *)&local_60,(unsigned_long *)&local_68,(unsigned_long *)(p_Var11 + 1));
          uVar5 = (long)&((_Hashtable *)&p_Var13->_M_color)->_M_buckets + uVar5;
        }
        p_Var11 = p_Var11->_M_nxt;
      } while (p_Var11 != (_Hash_node_base *)0x0);
    }
    if (local_60._M_impl.super__Rb_tree_header._M_node_count == 0) {
      bVar3 = false;
    }
    else {
      uVar5 = uVar5 / this->available_segments_per_buffer;
      iVar6 = GetInMemorySize(this);
      pBVar2 = this->block_manager;
      iVar7 = optional_idx::GetIndex(&pBVar2->block_alloc_size);
      p_Var1 = &local_60._M_impl.super__Rb_tree_header;
      iVar8 = optional_idx::GetIndex(&pBVar2->block_header_size);
      lVar12 = (iVar7 - iVar8) * uVar5;
      auVar14._8_4_ = (int)((ulong)lVar12 >> 0x20);
      auVar14._0_8_ = lVar12;
      auVar14._12_4_ = 0x45300000;
      auVar15._8_4_ = (int)(iVar6 >> 0x20);
      auVar15._0_8_ = iVar6;
      auVar15._12_4_ = 0x45300000;
      dVar16 = ((auVar14._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0)) /
               ((auVar15._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)iVar6) - 4503599627370496.0));
      bVar3 = 0.1 <= dVar16;
      if (0.1 <= dVar16) {
        while (local_60._M_impl.super__Rb_tree_header._M_node_count != uVar5) {
          ::std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::_Select1st<std::pair<unsigned_long_const,unsigned_long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
          ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::_Select1st<std::pair<unsigned_long_const,unsigned_long>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
                              *)&local_60,
                             (iterator)local_60._M_impl.super__Rb_tree_header._M_header._M_left);
        }
        if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
          p_Var13 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            local_68 = p_Var13[1]._M_parent;
            p_Var9 = (this->buffers)._M_h._M_buckets
                     [(ulong)local_68 % (this->buffers)._M_h._M_bucket_count];
            for (p_Var10 = p_Var9->_M_nxt; local_68 != (_Base_ptr)p_Var10[1]._M_nxt;
                p_Var10 = p_Var10->_M_nxt) {
              p_Var9 = p_Var10;
            }
            pFVar4 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                     ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                                   *)(p_Var9->_M_nxt + 2));
            pFVar4->vacuum = true;
            ::std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::_M_erase(&(this->buffers_with_free_space)._M_h,&local_68);
            p_Var13 = (_Base_ptr)::std::_Rb_tree_increment(p_Var13);
          } while ((_Rb_tree_header *)p_Var13 != p_Var1);
        }
        NextBufferWithFreeSpace(this);
        if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
          p_Var13 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            local_68 = (_Base_ptr)&this->vacuum_buffers;
            ::std::
            _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                      ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)&this->vacuum_buffers,&p_Var13[1]._M_parent,&local_68);
            p_Var13 = (_Base_ptr)::std::_Rb_tree_increment(p_Var13);
          } while ((_Rb_tree_header *)p_Var13 != p_Var1);
        }
      }
    }
    ::std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
    ::~_Rb_tree(&local_60);
  }
  return bVar3;
}

Assistant:

bool FixedSizeAllocator::InitializeVacuum() {
	// NOTE: we do not vacuum buffers that are not in memory. We might consider changing this
	// in the future, although buffers on disk should almost never be eligible for a vacuum

	if (total_segment_count == 0) {
		Reset();
		return false;
	}
	RemoveEmptyBuffers();

	// determine if a vacuum is necessary
	multimap<idx_t, idx_t> temporary_vacuum_buffers;
	D_ASSERT(vacuum_buffers.empty());
	idx_t available_segments_in_memory = 0;

	for (auto &buffer : buffers) {
		buffer.second->vacuum = false;
		if (buffer.second->InMemory()) {
			auto available_segments_in_buffer = available_segments_per_buffer - buffer.second->segment_count;
			available_segments_in_memory += available_segments_in_buffer;
			temporary_vacuum_buffers.emplace(available_segments_in_buffer, buffer.first);
		}
	}

	// no buffers in memory
	if (temporary_vacuum_buffers.empty()) {
		return false;
	}

	auto excess_buffer_count = available_segments_in_memory / available_segments_per_buffer;

	// calculate the vacuum threshold adaptively
	D_ASSERT(excess_buffer_count < temporary_vacuum_buffers.size());
	idx_t memory_usage = GetInMemorySize();
	idx_t excess_memory_usage = excess_buffer_count * block_manager.GetBlockSize();
	auto excess_percentage = double(excess_memory_usage) / double(memory_usage);
	auto threshold = double(VACUUM_THRESHOLD) / 100.0;
	if (excess_percentage < threshold) {
		return false;
	}

	D_ASSERT(excess_buffer_count <= temporary_vacuum_buffers.size());
	D_ASSERT(temporary_vacuum_buffers.size() <= buffers.size());

	// erasing from a multimap, we vacuum the buffers with the most free spaces (least full)
	while (temporary_vacuum_buffers.size() != excess_buffer_count) {
		temporary_vacuum_buffers.erase(temporary_vacuum_buffers.begin());
	}

	// adjust the buffers, and erase all to-be-vacuumed buffers from the available buffer list
	for (auto &vacuum_buffer : temporary_vacuum_buffers) {
		auto buffer_id = vacuum_buffer.second;
		D_ASSERT(buffers.find(buffer_id) != buffers.end());
		buffers.find(buffer_id)->second->vacuum = true;
		buffers_with_free_space.erase(buffer_id);
	}
	D_ASSERT(!buffers_with_free_space.empty());
	NextBufferWithFreeSpace();

	for (auto &vacuum_buffer : temporary_vacuum_buffers) {
		vacuum_buffers.insert(vacuum_buffer.second);
	}
	return true;
}